

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fxch.c
# Opt level: O2

int Fxch_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nMaxDivExt,int fVerbose,int fVeryVerbose)

{
  int iDiv;
  int iVar1;
  int iVar2;
  Vec_Que_t *pVVar3;
  int *piVar4;
  float *pfVar5;
  int *piVar6;
  Fxch_Man_t *pFxchMan;
  abctime aVar7;
  abctime aVar8;
  abctime time;
  abctime time_00;
  abctime time_01;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  pFxchMan = Fxch_ManAlloc(vCubes);
  aVar7 = Abc_Clock();
  Fxch_CubesGruping(pFxchMan);
  Fxch_ManMapLiteralsIntoCubes(pFxchMan,ObjIdMax);
  Fxch_ManGenerateLitHashKeys(pFxchMan);
  Fxch_ManComputeLevel(pFxchMan);
  Fxch_ManSCHashTablesInit(pFxchMan);
  Fxch_ManDivCreate(pFxchMan);
  aVar8 = Abc_Clock();
  pFxchMan->timeInit = aVar8 - aVar7;
  if (fVeryVerbose != 0) {
    Fxch_ManPrintDivs(pFxchMan);
  }
  if (fVerbose != 0) {
    Fxch_ManPrintStats(pFxchMan);
  }
  aVar7 = Abc_Clock();
  for (iVar10 = 0; iVar10 < nMaxDivExt || nMaxDivExt == 0; iVar10 = iVar10 + 1) {
    pVVar3 = pFxchMan->vDivPrio;
    if (pVVar3->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0x88,"int Vec_QueSize(Vec_Que_t *)");
    }
    if (pVVar3->nSize == 1) break;
    piVar4 = pVVar3->pHeap;
    iDiv = piVar4[1];
    pfVar5 = *pVVar3->pCostsFlt;
    if (pfVar5 == (float *)0x0) {
      fVar13 = (float)iDiv;
    }
    else {
      fVar13 = pfVar5[iDiv];
    }
    if (fVar13 <= 0.0) break;
    piVar6 = pVVar3->pOrder;
    piVar6[iDiv] = -1;
    iVar1 = pVVar3->nSize;
    pVVar3->nSize = iVar1 + -1;
    if (iVar1 + -1 == 1) {
      piVar4[1] = -1;
    }
    else {
      iVar2 = piVar4[(long)iVar1 + -1];
      piVar4[(long)iVar1 + -1] = -1;
      piVar4[1] = iVar2;
      piVar6[iVar2] = 1;
      if (pfVar5 == (float *)0x0) {
        fVar13 = (float)iVar2;
      }
      else {
        fVar13 = pfVar5[iVar2];
      }
      uVar11 = 1;
      while( true ) {
        uVar12 = uVar11 * 2;
        iVar1 = pVVar3->nSize;
        if (iVar1 <= (int)uVar12) break;
        uVar9 = uVar12 | 1;
        if ((int)uVar9 < iVar1) {
          if (pfVar5 == (float *)0x0) {
            fVar14 = (float)piVar4[(int)uVar12];
            fVar15 = (float)piVar4[(int)uVar9];
          }
          else {
            fVar14 = pfVar5[piVar4[(int)uVar12]];
            fVar15 = pfVar5[piVar4[(int)uVar9]];
          }
          if (fVar14 < fVar15) {
            uVar12 = uVar9;
          }
        }
        if (iVar1 <= (int)uVar12) {
          __assert_fail("child < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
        }
        iVar1 = piVar4[(int)uVar12];
        if (pfVar5 == (float *)0x0) {
          fVar14 = (float)iVar1;
        }
        else {
          fVar14 = pfVar5[iVar1];
        }
        if (fVar14 <= fVar13) break;
        piVar4[(int)uVar11] = iVar1;
        piVar6[iVar1] = uVar11;
        uVar11 = uVar12;
      }
      piVar4[(int)uVar11] = iVar2;
      piVar6[iVar2] = uVar11;
    }
    if (fVeryVerbose != 0) {
      Fxch_DivPrint(pFxchMan,iDiv);
    }
    Fxch_ManUpdate(pFxchMan,iDiv);
  }
  aVar8 = Abc_Clock();
  pFxchMan->timeExt = aVar8 - aVar7;
  if (fVerbose != 0) {
    Fxch_ManPrintStats(pFxchMan);
    Abc_PrintTime(0x7f3040,(char *)(pFxchMan->timeExt + pFxchMan->timeInit),time);
    Abc_PrintTime(0x7f3055,(char *)pFxchMan->timeInit,time_00);
    Abc_PrintTime(0x7f3068,(char *)pFxchMan->timeExt,time_01);
  }
  Fxch_CubesUnGruping(pFxchMan);
  Fxch_ManSCHashTablesFree(pFxchMan);
  Fxch_ManFree(pFxchMan);
  Vec_WecRemoveEmpty(vCubes);
  qsort(vCubes->pArray,(long)vCubes->nSize,0x10,Vec_WecSortCompare3);
  return 1;
}

Assistant:

int Fxch_FastExtract( Vec_Wec_t* vCubes,
                      int ObjIdMax,
                      int nMaxDivExt,
                      int fVerbose,
                      int fVeryVerbose )
{
    abctime TempTime;
    Fxch_Man_t* pFxchMan = Fxch_ManAlloc( vCubes );
    int i;

    TempTime = Abc_Clock();
    Fxch_CubesGruping( pFxchMan );
    Fxch_ManMapLiteralsIntoCubes( pFxchMan, ObjIdMax );
    Fxch_ManGenerateLitHashKeys( pFxchMan );
    Fxch_ManComputeLevel( pFxchMan );
    Fxch_ManSCHashTablesInit( pFxchMan );
    Fxch_ManDivCreate( pFxchMan );
    pFxchMan->timeInit = Abc_Clock() - TempTime;

    if ( fVeryVerbose )
        Fxch_ManPrintDivs( pFxchMan );

    if ( fVerbose )
        Fxch_ManPrintStats( pFxchMan );

    TempTime = Abc_Clock();
    
    for ( i = 0; (!nMaxDivExt || i < nMaxDivExt) && Vec_QueTopPriority( pFxchMan->vDivPrio ) > 0.0; i++ )
    {
        int iDiv = Vec_QuePop( pFxchMan->vDivPrio );

        if ( fVeryVerbose )
            Fxch_DivPrint( pFxchMan, iDiv );

        Fxch_ManUpdate( pFxchMan, iDiv );
    }
   
    pFxchMan->timeExt = Abc_Clock() - TempTime;

    if ( fVerbose )
    {
        Fxch_ManPrintStats( pFxchMan );
        Abc_PrintTime( 1, "\n[FXCH] Elapsed Time", pFxchMan->timeInit + pFxchMan->timeExt );
        Abc_PrintTime( 1, "[FXCH]    +-> Init", pFxchMan->timeInit );
        Abc_PrintTime( 1, "[FXCH]    +-> Extr", pFxchMan->timeExt );
    }

    Fxch_CubesUnGruping( pFxchMan );
    Fxch_ManSCHashTablesFree( pFxchMan );
    Fxch_ManFree( pFxchMan );

    Vec_WecRemoveEmpty( vCubes );
    Vec_WecSortByFirstInt( vCubes, 0 );

    return 1;
}